

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nls.c
# Opt level: O3

double enorm(double *x,int N)

{
  double dVar1;
  ulong uVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  
  dVar6 = 0.0;
  dVar5 = 0.0;
  if (0 < N) {
    uVar2 = 0;
    dVar8 = 0.0;
    dVar7 = 0.0;
    dVar3 = 0.0;
    do {
      dVar1 = x[uVar2];
      dVar4 = ABS(dVar1);
      if (1.304e+19 / (double)N <= dVar4) {
        if (dVar4 <= dVar8) {
          dVar3 = dVar3 + (dVar4 / dVar8) * (dVar4 / dVar8);
        }
        else {
          dVar3 = dVar3 * (dVar8 / dVar4) * (dVar8 / dVar4) + 1.0;
          dVar8 = dVar4;
        }
      }
      else if (dVar4 <= 3.834e-20) {
        if (dVar4 <= dVar5) {
          if ((dVar1 != 0.0) || (NAN(dVar1))) {
            dVar6 = dVar6 + (dVar4 / dVar5) * (dVar4 / dVar5);
          }
        }
        else {
          dVar6 = dVar6 * (dVar5 / dVar4) * (dVar5 / dVar4) + 1.0;
          dVar5 = dVar4;
        }
      }
      else {
        dVar7 = dVar7 + dVar1 * dVar1;
      }
      uVar2 = uVar2 + 1;
    } while ((uint)N != uVar2);
    if ((dVar3 != 0.0) || (NAN(dVar3))) {
      dVar3 = dVar3 + (dVar7 / dVar8) / dVar8;
      if (dVar3 < 0.0) {
        dVar3 = sqrt(dVar3);
      }
      else {
        dVar3 = SQRT(dVar3);
      }
      return dVar8 * dVar3;
    }
    if ((dVar7 != 0.0) || (NAN(dVar7))) {
      if (dVar5 <= dVar7) {
        dVar8 = (dVar6 * dVar5 * (dVar5 / dVar7) + 1.0) * dVar7;
        if (dVar8 < 0.0) {
          dVar8 = sqrt(dVar8);
        }
        else {
          dVar8 = SQRT(dVar8);
        }
      }
      if (dVar5 <= dVar7) {
        return dVar8;
      }
      dVar5 = (dVar6 * dVar5 + dVar7 / dVar5) * dVar5;
      if (0.0 <= dVar5) {
        return SQRT(dVar5);
      }
      dVar5 = sqrt(dVar5);
      return dVar5;
    }
  }
  if (dVar6 < 0.0) {
    dVar6 = sqrt(dVar6);
  }
  else {
    dVar6 = SQRT(dVar6);
  }
  return dVar5 * dVar6;
}

Assistant:

double enorm(double *x, int N) {
	double enrm;
	int i;
    double agiant,floatn,one,rdwarf,rgiant,s1,s2,s3,xabs,x1max,x3max,zero;

	/*
	 * C Translation of Fortran Code
	 * Argonne national laboratory. minpack project. march 1980.
      burton s. garbow, kenneth e. hillstrom, jorge j. more
	 */

    one = 1.0;
    zero = 0.0;
    rdwarf = 3.834e-20;
    rgiant = 1.304e19;
    s1 = s2 = s3 = x1max = x3max = zero;
    floatn = N;
    agiant = rgiant / floatn;

    for(i = 0; i < N;++i) {
    	xabs = fabs(x[i]);
    	if (xabs >= agiant) {
    		//sum for large components
    		if (xabs > x1max) {
    			s1 = one + s1*(x1max/xabs)*(x1max/xabs);
    			x1max = xabs;
    		} else {
    			s1 = s1 + (xabs/x1max)*(xabs/x1max);
    		}
    	} else if (xabs <= rdwarf) {
    		//sum for small components
    		if (xabs > x3max) {
                s3 = one + s3*(x3max/xabs)*(x3max/xabs);
                x3max = xabs;
    		} else {
    			if (xabs != zero) {
    				s3 = s3 + (xabs/x3max)*(xabs/x3max);
    			}
    		}

    	} else {
    		//sum for intermediate components.
    		s2 += xabs*xabs;
    	}
    }

    if (s1 != zero) {
    	enrm = x1max*sqrt(s1+(s2/x1max)/x1max);
    } else {
    	if (s2 != zero) {
    		if (s2 >= x3max) {
    			enrm = sqrt(s2*(one+(x3max/s2)*(x3max*s3)));
    		}
    		if (s2 < x3max) {
    			enrm = sqrt(x3max*((s2/x3max)+(x3max*s3)));
    		}
    	} else {
    		enrm = x3max*sqrt(s3);
    	}
    }

	return enrm;
}